

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_fp_encode_tiles_row_mt(AV1_COMP *cpi)

{
  int *piVar1;
  ThreadData_conflict *__src;
  EncWorkerData *pEVar2;
  uint uVar3;
  uint uVar4;
  TileDataEnc *pTVar5;
  AVxWorker *pAVar6;
  EncWorkerData *pEVar7;
  macroblock *mb;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  ThreadData_conflict *mb_00;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int tile_rows;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  AV1_COMMON *cm;
  
  uVar3 = (cpi->common).tiles.cols;
  uVar4 = (cpi->common).tiles.rows;
  iVar8 = (cpi->common).mi_params.mi_rows;
  uVar11 = 0;
  uVar10 = 0;
  if (0 < (int)uVar4) {
    uVar10 = (ulong)uVar4;
  }
  uVar14 = 0;
  while (uVar10 != uVar11) {
    piVar1 = (cpi->common).tiles.row_start_sb + uVar11;
    bVar9 = (byte)((cpi->common).seq_params)->mib_size_log2;
    iVar12 = (cpi->common).tiles.row_start_sb[uVar11 + 1] << (bVar9 & 0x1f);
    uVar11 = uVar11 + 1;
    if (iVar8 <= iVar12) {
      iVar12 = iVar8;
    }
    uVar13 = (~(-1 << (""[cpi->fp_block_size] & 0x1f)) - (*piVar1 << (bVar9 & 0x1f))) + iVar12 >>
             (""[cpi->fp_block_size] & 0x1f);
    if ((int)uVar14 <= (int)uVar13) {
      uVar14 = uVar13;
    }
  }
  bVar19 = true;
  if (((cpi->mt_info).enc_row_mt.allocated_tile_cols == uVar3) &&
     ((cpi->mt_info).enc_row_mt.allocated_tile_rows == uVar4)) {
    bVar19 = (cpi->mt_info).enc_row_mt.allocated_rows != uVar14;
  }
  if (cpi->allocated_tiles < (int)(uVar4 * uVar3)) {
    av1_alloc_tile_data(cpi);
  }
  if (bVar19) {
    row_mt_mem_alloc(cpi,uVar14,-1,0);
  }
  piVar1 = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id;
  av1_init_tile_data(cpi);
  uVar13 = (cpi->mt_info).num_mod_workers[0];
  if (uVar13 == 0) {
    uVar13 = av1_fp_compute_num_enc_workers(cpi);
  }
  memset(piVar1,0xff,0x100);
  (cpi->mt_info).enc_row_mt.firstpass_mt_exit = false;
  uVar17 = 0;
  uVar11 = 0;
  if (0 < (int)uVar3) {
    uVar11 = (ulong)uVar3;
  }
  lVar15 = 0x5d00;
  for (; lVar16 = lVar15, uVar18 = uVar11, uVar17 != uVar10; uVar17 = uVar17 + 1) {
    while (bVar19 = uVar18 != 0, uVar18 = uVar18 - 1, bVar19) {
      pTVar5 = cpi->tile_data;
      memset(*(void **)((long)((pTVar5->tctx).txb_skip_cdf + -1) + 0x16 + lVar16),0xff,
             (ulong)uVar14 << 2);
      *(undefined4 *)((long)((pTVar5->tctx).txb_skip_cdf + -1) + 0x2a + lVar16) =
           *(undefined4 *)((long)pTVar5 + lVar16 + -0x5d00);
      *(undefined4 *)((long)((pTVar5->tctx).txb_skip_cdf + -1) + 0x2e + lVar16) = 0;
      *(undefined4 *)((long)((pTVar5->tctx).txb_skip_cdf + -1) + 0x22 + lVar16) = 0;
      lVar16 = lVar16 + 0x5d10;
    }
    lVar15 = lVar15 + (long)(int)uVar3 * 0x5d10;
  }
  uVar14 = (cpi->mt_info).num_workers;
  if ((int)uVar13 < (int)uVar14) {
    uVar14 = uVar13;
  }
  uVar11 = (ulong)uVar14;
  assign_tile_to_thread(piVar1,uVar4 * uVar3,uVar14);
  __src = &cpi->td;
  uVar10 = uVar11;
  while (iVar8 = (int)uVar10, 0 < iVar8) {
    uVar10 = uVar10 - 1;
    uVar17 = uVar10 & 0xffffffff;
    pAVar6 = (cpi->mt_info).workers;
    pEVar7 = (cpi->mt_info).tile_thr_data;
    pEVar2 = pEVar7 + uVar17;
    pAVar6[uVar17].hook = fp_enc_row_mt_worker_hook;
    pAVar6[uVar17].data1 = pEVar2;
    pAVar6[uVar17].data2 = (void *)0x0;
    pEVar7[uVar17].thread_id = iVar8 + -1;
    pEVar7[uVar17].start = iVar8 + -1;
    pEVar7[uVar17].cpi = cpi;
    if (iVar8 == 1) {
      pEVar2->td = __src;
      mb_00 = __src;
    }
    else {
      pEVar2->td = pEVar2->original_td;
      memcpy(pEVar2->original_td,__src,0x256b0);
      mb_00 = pEVar2->td;
    }
    av1_alloc_src_diff_buf(&cpi->common,&mb_00->mb);
  }
  launch_workers(&cpi->mt_info,uVar14);
  sync_enc_workers(&cpi->mt_info,&cpi->common,uVar14);
  lVar15 = uVar11 * 0x1d0 + -0x1c8;
  for (; 0 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
    mb = *(macroblock **)((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar15 + -0x20);
    if ((ThreadData_conflict *)mb != __src) {
      av1_dealloc_src_diff_buf(mb,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
    }
    lVar15 = lVar15 + -0x1d0;
  }
  return;
}

Assistant:

void av1_fp_encode_tiles_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int *thread_id_to_tile_id = enc_row_mt->thread_id_to_tile_id;
  int num_workers = 0;
  int max_mb_rows = 0;

  max_mb_rows = fp_compute_max_mb_rows(cm, cpi->fp_block_size);
  const bool alloc_row_mt_mem = enc_row_mt->allocated_tile_cols != tile_cols ||
                                enc_row_mt->allocated_tile_rows != tile_rows ||
                                enc_row_mt->allocated_rows != max_mb_rows;
  const bool alloc_tile_data = cpi->allocated_tiles < tile_cols * tile_rows;

  assert(IMPLIES(cpi->tile_data == NULL, alloc_tile_data));
  if (alloc_tile_data) {
    av1_alloc_tile_data(cpi);
  }

  assert(IMPLIES(alloc_tile_data, alloc_row_mt_mem));
  if (alloc_row_mt_mem) {
    row_mt_mem_alloc(cpi, max_mb_rows, -1, 0);
  }

  av1_init_tile_data(cpi);

  // For pass = 1, compute the no. of workers needed. For single-pass encode
  // (pass = 0), no. of workers are already computed.
  if (mt_info->num_mod_workers[MOD_FP] == 0)
    num_workers = av1_fp_compute_num_enc_workers(cpi);
  else
    num_workers = mt_info->num_mod_workers[MOD_FP];

  memset(thread_id_to_tile_id, -1,
         sizeof(*thread_id_to_tile_id) * MAX_NUM_THREADS);
  enc_row_mt->firstpass_mt_exit = false;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

      // Initialize num_finished_cols to -1 for all rows.
      memset(row_mt_sync->num_finished_cols, -1,
             sizeof(*row_mt_sync->num_finished_cols) * max_mb_rows);
      row_mt_sync->next_mi_row = this_tile->tile_info.mi_row_start;
      row_mt_sync->num_threads_working = 0;

      // intraBC mode is not evaluated during first-pass encoding. Hence, no
      // additional top-right delay is required.
      row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
    }
  }

  num_workers = AOMMIN(num_workers, mt_info->num_workers);
  assign_tile_to_thread(thread_id_to_tile_id, tile_cols * tile_rows,
                        num_workers);
  fp_prepare_enc_workers(cpi, fp_enc_row_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  dealloc_thread_data_src_diff_buf(cpi, num_workers);
}